

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O2

psa_status_t psa_open_key(psa_key_file_id_t id,psa_key_handle_t *handle)

{
  psa_status_t pVar1;
  size_t key_data_length;
  uint8_t *key_data;
  psa_key_slot_t *slot;
  size_t local_38;
  uint8_t *local_30;
  psa_key_slot_t *local_28;
  
  *handle = 0;
  if ((int)id < 1) {
    pVar1 = -0x87;
  }
  else {
    pVar1 = psa_get_empty_key_slot(handle,&local_28);
    if (pVar1 == 0) {
      (local_28->attr).lifetime = 1;
      (local_28->attr).id = id;
      local_30 = (uint8_t *)0x0;
      local_38 = 0;
      pVar1 = psa_load_persistent_key(&local_28->attr,&local_30,&local_38);
      if (pVar1 == 0) {
        pVar1 = psa_import_key_into_slot(local_28,local_30,local_38);
      }
      psa_free_persistent_key_data(local_30,local_38);
      if (pVar1 == 0) {
        pVar1 = 0;
      }
      else {
        psa_wipe_key_slot(local_28);
        *handle = 0;
      }
    }
  }
  return pVar1;
}

Assistant:

psa_status_t psa_open_key( psa_key_file_id_t id, psa_key_handle_t *handle )
{
#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    psa_status_t status;
    psa_key_slot_t *slot;

    *handle = 0;

    status = psa_validate_persistent_key_parameters(
        PSA_KEY_LIFETIME_PERSISTENT, id, NULL, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    slot->attr.lifetime = PSA_KEY_LIFETIME_PERSISTENT;
    slot->attr.id = id;

    status = psa_load_persistent_key_into_slot( slot );
    if( status != PSA_SUCCESS )
    {
        psa_wipe_key_slot( slot );
        *handle = 0;
    }
    return( status );

#else /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
    (void) id;
    *handle = 0;
    return( PSA_ERROR_NOT_SUPPORTED );
#endif /* !defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
}